

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_int_int_int_int *func,char_data **args,int *args_1,int *args_2,
          int *args_3,int *args_4)

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  function<void_()> *in_RDI;
  CLogger *in_R8;
  undefined8 *in_R9;
  undefined4 *in_stack_00000008;
  undefined4 *in_stack_00000010;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_int_&,_int_&,_int_&,_int_&> tuple;
  int *in_stack_fffffffffffffe78;
  value_type *__x;
  int *in_stack_fffffffffffffe80;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffe88;
  anon_class_32_6_d2068f32 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe90;
  char_data **in_stack_fffffffffffffe98;
  function<void_()> *args_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_stack_fffffffffffffec8;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_stack_fffffffffffffed0;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  string local_100 [32];
  undefined1 local_e0 [112];
  anon_class_32_6_d2068f32 local_70;
  undefined8 local_48;
  undefined8 *local_30;
  CLogger *local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_48 = 5;
    fmt._M_str = (char *)in_stack_fffffffffffffec8;
    fmt._M_len = (size_t)in_stack_fffffffffffffec0;
    CLogger::Warn<unsigned_long>((CLogger *)in_stack_fffffffffffffeb8,fmt,(unsigned_long *)in_RDI);
  }
  __f = &local_70;
  std::tuple<char_data_*&,_int_&,_int_&,_int_&,_int_&>::tuple<true,_true>
            ((tuple<char_data_*&,_int_&,_int_&,_int_&,_int_&> *)in_RCX,in_stack_fffffffffffffe98,
             (int *)in_stack_fffffffffffffe90,(int *)__f,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  GetCharacterData<char_data*&,int&,int&,int&,int&>
            ((CQueue *)in_RDX,(tuple<char_data_*&,_int_&,_int_&,_int_&,_int_&> *)in_RCX);
  args_2_00 = in_RDI;
  std::__cxx11::string::string(local_100,in_RDX);
  this_00 = (queueEntry_t *)local_e0;
  std::__cxx11::string::string((string *)this_00,in_RCX);
  __x = (value_type *)(local_e0 + 0x20);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar1 = *local_30;
  uVar2 = *in_stack_00000008;
  uVar3 = *in_stack_00000010;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&)::_lambda()_1_,void>
            (in_RDI,__f);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,__x);
  queueEntry_t::~queueEntry_t(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)__f);
  fmt_00._M_str._0_4_ = uVar2;
  fmt_00._M_len = uVar1;
  fmt_00._M_str._4_4_ = uVar3;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            (local_28,fmt_00,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(int *)args_2_00);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDI);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}